

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.h
# Opt level: O3

void __thiscall
cfd::core::DescriptorKeyReference::~DescriptorKeyReference(DescriptorKeyReference *this)

{
  if (*(DescriptorKeyReference **)(this + 0x270) != this + 0x280) {
    operator_delete(*(DescriptorKeyReference **)(this + 0x270));
  }
  KeyData::~KeyData((KeyData *)(this + 0x120));
  if (*(void **)(this + 0x108) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x108));
  }
  if (*(void **)(this + 0xf0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xf0));
  }
  if (*(void **)(this + 0xd8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xd8));
  }
  if (*(void **)(this + 0xb0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xb0));
  }
  if (*(void **)(this + 0x98) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x98));
  }
  if (*(void **)(this + 0x78) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x78));
  }
  if (*(void **)(this + 0x60) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x60));
  }
  if (*(void **)(this + 0x38) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x38));
  }
  if (*(void **)(this + 0x20) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x20));
  }
  if (*(void **)(this + 8) != (void *)0x0) {
    operator_delete(*(void **)(this + 8));
    return;
  }
  return;
}

Assistant:

class CFD_CORE_EXPORT DescriptorKeyReference {
 public:
  /**
   * @brief constructor.
   */
  DescriptorKeyReference();
  /**
   * @brief constructor.
   * @param[in] pubkey      pubkey
   */
  explicit DescriptorKeyReference(const Pubkey& pubkey);
  /**
   * @brief constructor.
   * @param[in] pubkey      schnorr pubkey
   */
  explicit DescriptorKeyReference(const SchnorrPubkey& pubkey);
  /**
   * @brief constructor.
   * @param[in] ext_privkey   ext privkey
   * @param[in] arg           argument
   */
  explicit DescriptorKeyReference(
      const ExtPrivkey& ext_privkey, const std::string* arg = nullptr);
  /**
   * @brief constructor.
   * @param[in] ext_pubkey   ext pubkey
   * @param[in] arg           argument
   */
  explicit DescriptorKeyReference(
      const ExtPubkey& ext_pubkey, const std::string* arg = nullptr);
  /**
   * @brief constructor.
   * @param[in] key      key data
   * @param[in] arg      argument
   */
  explicit DescriptorKeyReference(
      const KeyData& key, const std::string* arg = nullptr);
  /**
   * @brief copy constructor.
   * @param[in] object    DescriptorKeyReference object
   */
  DescriptorKeyReference(const DescriptorKeyReference& object);
  /**
   * @brief copy constructor.
   * @param[in] object    DescriptorKeyReference object
   * @return DescriptorKeyReference object
   */
  DescriptorKeyReference& operator=(const DescriptorKeyReference& object);

  /**
   * @brief getting pubkey.
   * @return pubkey
   */
  Pubkey GetPubkey() const;
  /**
   * @brief getting schnorr pubkey.
   * @return pubkey
   */
  SchnorrPubkey GetSchnorrPubkey() const;
  /**
   * @brief getting argument.
   * @return argument
   */
  std::string GetArgument() const;
  /**
   * @brief exist ext-privkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasExtPrivkey() const;
  /**
   * @brief exist ext-pubkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasExtPubkey() const;
  /**
   * @brief exist schnorr pubkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasSchnorrPubkey() const;
  /**
   * @brief getting ext-privkey.
   * @details need ext-privkey exists.
   * @return ext-privkey
   */
  ExtPrivkey GetExtPrivkey() const;
  /**
   * @brief getting ext-pubkey.
   * @details need ext-pubkey exists.
   * @return ext-pubkey
   */
  ExtPubkey GetExtPubkey() const;
  /**
   * @brief getting key data.
   * @return key data
   */
  KeyData GetKeyData() const;
  /**
   * @brief getting key type.
   * @return key type
   */
  DescriptorKeyType GetKeyType() const;

 private:
  DescriptorKeyType key_type_;    //!< node key type
  SchnorrPubkey schnorr_pubkey_;  //!< schnorr pubkey
  Pubkey pubkey_;                 //!< pubkey
  ExtPrivkey extprivkey_;         //!< ext privkey
  ExtPubkey extpubkey_;           //!< ext pubkey
  KeyData key_data_;              //!< key data
  std::string argument_;          //!< argument
}